

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryAllocationTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::RandomAllocFreeTestInstance::RandomAllocFreeTestInstance
          (RandomAllocFreeTestInstance *this,Context *context,deUint32 seed)

{
  VkDeviceSize VVar1;
  int iVar2;
  deBool dVar3;
  DeviceInterface *vk;
  VkDevice device;
  size_t sVar4;
  TestContext *this_00;
  Platform *pPVar5;
  undefined4 extraout_var;
  VkPhysicalDevice physicalDevice_00;
  TestError *pTVar6;
  reference pvVar7;
  ulong uVar8;
  vector<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
  *this_01;
  undefined1 local_25c [8];
  MemoryType type;
  deUint32 memoryTypeNdx;
  deUint32 heapNdx;
  VkPhysicalDeviceMemoryProperties memoryProperties;
  InstanceInterface *vki;
  VkPhysicalDevice physicalDevice;
  deUint32 seed_local;
  Context *context_local;
  RandomAllocFreeTestInstance *this_local;
  
  TestInstance::TestInstance(&this->super_TestInstance,context);
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__RandomAllocFreeTestInstance_016666d0;
  this->m_opCount = 0x80;
  vk = vkt::Context::getDeviceInterface(context);
  device = vkt::Context::getDevice(context);
  sVar4 = computeDeviceMemorySystemMemFootprint(vk,device);
  this->m_allocSysMemSize = sVar4 + 0x10;
  this_00 = vkt::Context::getTestContext(context);
  pPVar5 = tcu::TestContext::getPlatform(this_00);
  iVar2 = (*pPVar5->_vptr_Platform[5])();
  ::vk::getMemoryLimits(&this->m_memoryLimits,(Platform *)CONCAT44(extraout_var,iVar2));
  this->m_memoryObjectCount = 0;
  this->m_opNdx = 0;
  de::Random::Random(&this->m_rng,seed);
  std::
  vector<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
  ::vector(&this->m_heaps);
  this->m_totalSystemMem = 0;
  this->m_totalDeviceMem = 0;
  physicalDevice_00 = vkt::Context::getPhysicalDevice(context);
  memoryProperties.memoryHeaps[0xf]._8_8_ = vkt::Context::getInstanceInterface(context);
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)&memoryTypeNdx,
             (InstanceInterface *)memoryProperties.memoryHeaps[0xf]._8_8_,physicalDevice_00);
  do {
    dVar3 = ::deGetFalse();
    if ((dVar3 != 0) || (0x20 < memoryProperties.memoryTypes[0x1f].propertyFlags)) {
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,(char *)0x0,"memoryProperties.memoryHeapCount <= 32",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryAllocationTests.cpp"
                 ,0x147);
      __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  do {
    dVar3 = ::deGetFalse();
    if ((dVar3 != 0) || (0x20 < memoryTypeNdx)) {
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,(char *)0x0,"memoryProperties.memoryTypeCount <= 32",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryAllocationTests.cpp"
                 ,0x148);
      __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  std::
  vector<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
  ::resize(&this->m_heaps,(ulong)memoryProperties.memoryTypes[0x1f].propertyFlags);
  for (type.type.heapIndex = 0;
      type.type.heapIndex < memoryProperties.memoryTypes[0x1f].propertyFlags;
      type.type.heapIndex = type.type.heapIndex + 1) {
    uVar8 = (ulong)type.type.heapIndex;
    this_01 = &this->m_heaps;
    pvVar7 = std::
             vector<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
             ::operator[](this_01,uVar8);
    VVar1 = memoryProperties.memoryHeaps[uVar8].size;
    (pvVar7->heap).size = *(VkDeviceSize *)&memoryProperties.memoryHeaps[uVar8 - 1].flags;
    *(VkDeviceSize *)&(pvVar7->heap).flags = VVar1;
    pvVar7 = std::
             vector<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
             ::operator[](this_01,(ulong)type.type.heapIndex);
    pvVar7->memoryUsage = 0;
    pvVar7 = std::
             vector<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
             ::operator[](this_01,(ulong)type.type.heapIndex);
    uVar8 = (pvVar7->heap).size;
    pvVar7 = std::
             vector<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
             ::operator[](this_01,(ulong)type.type.heapIndex);
    pvVar7->maxMemoryUsage = uVar8 >> 1;
    pvVar7 = std::
             vector<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
             ::operator[](this_01,(ulong)type.type.heapIndex);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
    ::reserve(&pvVar7->objects,100);
  }
  type.type.propertyFlags = 0;
  do {
    if (memoryTypeNdx <= type.type.propertyFlags) {
      return;
    }
    local_25c._0_4_ = type.type.propertyFlags;
    unique0x00012000 = memoryProperties.memoryTypes[(ulong)type.type.propertyFlags - 1];
    do {
      dVar3 = ::deGetFalse();
      if ((dVar3 != 0) || (memoryProperties.memoryTypes[0x1f].propertyFlags <= type.index)) {
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar6,(char *)0x0,"type.type.heapIndex < memoryProperties.memoryHeapCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryAllocationTests.cpp"
                   ,0x15d);
        __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    pvVar7 = std::
             vector<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
             ::operator[](&this->m_heaps,(ulong)stack0xfffffffffffffda8 >> 0x20);
    std::
    vector<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>
    ::push_back(&pvVar7->types,(value_type *)local_25c);
    type.type.propertyFlags = type.type.propertyFlags + 1;
  } while( true );
}

Assistant:

RandomAllocFreeTestInstance::RandomAllocFreeTestInstance (Context& context, deUint32 seed)
	: TestInstance			(context)
	, m_opCount				(128)
	, m_allocSysMemSize		(computeDeviceMemorySystemMemFootprint(context.getDeviceInterface(), context.getDevice())
							 + sizeof(MemoryObject))
	, m_memoryLimits		(getMemoryLimits(context.getTestContext().getPlatform().getVulkanPlatform()))
	, m_memoryObjectCount	(0)
	, m_opNdx				(0)
	, m_rng					(seed)
	, m_totalSystemMem		(0)
	, m_totalDeviceMem		(0)
{
	const VkPhysicalDevice					physicalDevice		= context.getPhysicalDevice();
	const InstanceInterface&				vki					= context.getInstanceInterface();
	const VkPhysicalDeviceMemoryProperties	memoryProperties	= getPhysicalDeviceMemoryProperties(vki, physicalDevice);

	TCU_CHECK(memoryProperties.memoryHeapCount <= 32);
	TCU_CHECK(memoryProperties.memoryTypeCount <= 32);

	m_heaps.resize(memoryProperties.memoryHeapCount);

	for (deUint32 heapNdx = 0; heapNdx < memoryProperties.memoryHeapCount; heapNdx++)
	{
		m_heaps[heapNdx].heap			= memoryProperties.memoryHeaps[heapNdx];
		m_heaps[heapNdx].memoryUsage	= 0;
		m_heaps[heapNdx].maxMemoryUsage	= m_heaps[heapNdx].heap.size / 2; /* Use at maximum 50% of heap */

		m_heaps[heapNdx].objects.reserve(100);
	}

	for (deUint32 memoryTypeNdx = 0; memoryTypeNdx < memoryProperties.memoryTypeCount; memoryTypeNdx++)
	{
		const MemoryType type =
		{
			memoryTypeNdx,
			memoryProperties.memoryTypes[memoryTypeNdx]
		};

		TCU_CHECK(type.type.heapIndex < memoryProperties.memoryHeapCount);

		m_heaps[type.type.heapIndex].types.push_back(type);
	}
}